

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
          (StateQueryMemoryWriteGuard<int> *this,ResultCollector *result)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = isPreguardContaminated(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"pre-guard value was modified",&local_31);
    tcu::ResultCollector::fail(result,&local_30);
  }
  else {
    bVar1 = isPostguardContaminated(this);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"post-guard value was modified",&local_31);
      tcu::ResultCollector::fail(result,&local_30);
    }
    else {
      bVar1 = isUndefined(this);
      if (!bVar1) {
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Get* did not return a value",&local_31);
      tcu::ResultCollector::fail(result,&local_30);
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}